

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall
HSimplexNla::reportVector
          (HSimplexNla *this,string *message,HighsInt num_index,
          vector<double,_std::allocator<double>_> *vector_value,
          vector<int,_std::allocator<int>_> *vector_index,bool force)

{
  HighsInt vecDim;
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  string local_70;
  string local_50;
  
  if (this->report_ == false) {
    if (num_index < 1 || !force) {
      return;
    }
  }
  else if (num_index < 1) {
    return;
  }
  if (0x19 < (uint)num_index) {
    vecDim = this->lp_->num_row_;
    pcVar1 = (message->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + message->_M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unknown","");
    analyseVectorValues((HighsLogOptions *)0x0,&local_50,vecDim,vector_value,true,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  iVar3 = 0;
  printf("%s",(message->_M_dataplus)._M_p);
  uVar2 = 0;
  do {
    if ((int)((uVar2 & 0xffffffff) / 5) * 5 + iVar3 == 0) {
      putchar(10);
    }
    printf("[%4d %11.4g] ",
           (vector_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar2],
           (ulong)(uint)(vector_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar2]);
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  } while ((uint)num_index != uVar2);
  putchar(10);
  return;
}

Assistant:

void HSimplexNla::reportVector(const std::string message,
                               const HighsInt num_index,
                               const vector<double> vector_value,
                               const vector<HighsInt> vector_index,
                               const bool force) const {
  if (!report_ && !force) return;
  assert((int)vector_value.size() >= num_index);
  if (num_index <= 0) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_index > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector_value, true);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iX = 0; iX < num_index; iX++) {
      if (iX % 5 == 0) printf("\n");
      printf("[%4d %11.4g] ", (int)vector_index[iX], vector_value[iX]);
    }
    printf("\n");
  }
}